

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::SetSerializedPbInterval
          (Generator *this,FileDescriptorProto *file)

{
  EnumDescriptor *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *descriptor_proto;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *message_proto;
  Descriptor *descriptor_00;
  ServiceDescriptor *descriptor_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *descriptor_proto_00;
  int i;
  int iVar1;
  FileDescriptor *this_00;
  string_view name;
  string_view name_00;
  string local_50;
  
  for (iVar1 = 0; this_00 = this->file_, iVar1 < this_00->enum_type_count_; iVar1 = iVar1 + 1) {
    descriptor = FileDescriptor::enum_type(this_00,iVar1);
    descriptor_proto =
         protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                   (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar1);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_50,this,descriptor);
    name._M_str = local_50._M_dataplus._M_p;
    name._M_len = local_50._M_string_length;
    PrintSerializedPbInterval<google::protobuf::EnumDescriptorProto>(this,descriptor_proto,name);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (iVar1 = 0; iVar1 < this_00->message_type_count_; iVar1 = iVar1 + 1) {
    message_proto =
         protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                   (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,iVar1);
    descriptor_00 = FileDescriptor::message_type(this->file_,iVar1);
    SetMessagePbInterval(this,message_proto,descriptor_00);
    this_00 = this->file_;
  }
  for (iVar1 = 0; iVar1 < this_00->service_count_; iVar1 = iVar1 + 1) {
    descriptor_01 = FileDescriptor::service(this_00,iVar1);
    descriptor_proto_00 =
         protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                   (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,iVar1);
    ModuleLevelServiceDescriptorName_abi_cxx11_(&local_50,this,descriptor_01);
    name_00._M_str = local_50._M_dataplus._M_p;
    name_00._M_len = local_50._M_string_length;
    PrintSerializedPbInterval<google::protobuf::ServiceDescriptorProto>
              (this,descriptor_proto_00,name_00);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = this->file_;
  }
  return;
}

Assistant:

void Generator::SetSerializedPbInterval(const FileDescriptorProto& file) const {
  // Top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& descriptor = *file_->enum_type(i);
    PrintSerializedPbInterval(file.enum_type(i),
                              ModuleLevelDescriptorName(descriptor));
  }

  // Messages.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    SetMessagePbInterval(file.message_type(i), *file_->message_type(i));
  }

  // Services.
  for (int i = 0; i < file_->service_count(); ++i) {
    const ServiceDescriptor& service = *file_->service(i);
    PrintSerializedPbInterval(file.service(i),
                              ModuleLevelServiceDescriptorName(service));
  }
}